

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O3

void __thiscall QMakeEvaluator::updateFeaturePaths(QMakeEvaluator *this)

{
  undefined1 *puVar1;
  QMakeGlobals *pQVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  char cVar6;
  FileType FVar7;
  pointer pQVar8;
  QMakeFeatureRoots *ptr;
  short sVar9;
  QString *item;
  QArrayData *pQVar10;
  ProString *sfx;
  ProString *pPVar11;
  long lVar12;
  QString *root;
  QString *pQVar13;
  ulong uVar14;
  long in_FS_OFFSET;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QDir specdir;
  ProKey local_190;
  QString local_160;
  QArrayDataPointer<QString> local_148;
  ProString local_128;
  QArrayDataPointer<QString> local_f8;
  QArrayDataPointer<QString> local_d8;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [48];
  QString *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar15.m_data = &DAT_00000008;
  QVar15.m_size = (qsizetype)local_78;
  QString::fromLatin1(QVar15);
  local_98._0_8_ = local_78._0_8_;
  local_98._8_8_ = local_78._8_8_;
  local_98._16_8_ = local_78._16_8_;
  QVar16.m_data = (storage_type *)0xa;
  QVar16.m_size = (qsizetype)local_78;
  QString::fromLatin1(QVar16);
  local_b8._0_8_ = local_78._0_8_;
  local_b8._8_8_ = local_78._8_8_;
  local_b8._16_8_ = local_78._16_8_;
  local_d8.d = (Data *)0x0;
  local_d8.ptr = (QString *)0x0;
  local_d8.size = 0;
  pQVar2 = this->m_option;
  QVar17.m_data = (storage_type *)0xd;
  QVar17.m_size = (qsizetype)local_78;
  QString::fromLatin1(QVar17);
  local_128.m_string.d.d = (Data *)local_78._0_8_;
  local_128.m_string.d.ptr = (char16_t *)local_78._8_8_;
  local_128.m_string.d.size = local_78._16_8_;
  QMakeGlobals::getPathListEnv((QStringList *)local_78,pQVar2,&local_128.m_string);
  QList<QString>::operator+=((QList<QString> *)&local_d8,(QList<QString> *)local_78);
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_78);
  if (&(local_128.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_128.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar13 = (this->m_qmakefeatures).d.ptr;
  QtPrivate::QCommonArrayOps<QString>::growAppend
            ((QCommonArrayOps<QString> *)&local_d8,pQVar13,pQVar13 + (this->m_qmakefeatures).d.size)
  ;
  pQVar2 = this->m_option;
  ProKey::ProKey((ProKey *)&local_128,"QMAKEFEATURES");
  QMakeProperty::value((ProString *)local_78,pQVar2->property,(ProKey *)&local_128);
  ProString::toQString((QString *)&local_f8,(ProString *)local_78);
  QMakeGlobals::splitPathList((QStringList *)&local_190,pQVar2,(QString *)&local_f8);
  QList<QString>::operator+=((QList<QString> *)&local_d8,(QList<QString> *)&local_190);
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_190);
  if (&(local_f8.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
    }
  }
  if (&(local_128.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_128.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_f8.d = (Data *)0x0;
  local_f8.ptr = (QString *)0x0;
  local_f8.size = 0;
  if ((this->m_buildRoot).d.size != 0) {
    local_128.m_string.d.ptr = (char16_t *)local_98;
    local_128.m_string.d.d = (Data *)&this->m_buildRoot;
    QStringBuilder<QString_&,_QString_&>::convertTo<QString>
              ((QString *)local_78,(QStringBuilder<QString_&,_QString_&> *)&local_128);
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_f8,local_f8.size,(QString *)local_78);
    QList<QString>::end((QList<QString> *)&local_f8);
    if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
      }
    }
    QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
              ((QMovableArrayOps<QString> *)&local_f8,local_f8.size,&this->m_buildRoot);
    QList<QString>::end((QList<QString> *)&local_f8);
  }
  if ((this->m_sourceRoot).d.size != 0) {
    local_128.m_string.d.ptr = (char16_t *)local_98;
    local_128.m_string.d.d = (Data *)&this->m_sourceRoot;
    QStringBuilder<QString_&,_QString_&>::convertTo<QString>
              ((QString *)local_78,(QStringBuilder<QString_&,_QString_&> *)&local_128);
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_f8,local_f8.size,(QString *)local_78);
    QList<QString>::end((QList<QString> *)&local_f8);
    if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
      }
    }
    QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
              ((QMovableArrayOps<QString> *)&local_f8,local_f8.size,&this->m_sourceRoot);
    QList<QString>::end((QList<QString> *)&local_f8);
  }
  local_148.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_148.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_148.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar2 = this->m_option;
  QVar18.m_data = (storage_type *)0x9;
  QVar18.m_size = (qsizetype)local_78;
  QString::fromLatin1(QVar18);
  local_128.m_string.d.d = (Data *)local_78._0_8_;
  local_128.m_string.d.ptr = (char16_t *)local_78._8_8_;
  local_128.m_string.d.size = local_78._16_8_;
  QMakeGlobals::getPathListEnv((QStringList *)&local_148,pQVar2,&local_128.m_string);
  if (&(local_128.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_128.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((undefined1 *)local_148.size != (undefined1 *)0x0) {
    lVar12 = local_148.size * 0x18;
    pQVar10 = (QArrayData *)local_148.ptr;
    do {
      local_128.m_string.d.d = (Data *)pQVar10;
      local_128.m_string.d.ptr = (char16_t *)local_98;
      QStringBuilder<const_QString_&,_QString_&>::convertTo<QString>
                ((QString *)local_78,(QStringBuilder<const_QString_&,_QString_&> *)&local_128);
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_f8,local_f8.size,(QString *)local_78);
      QList<QString>::end((QList<QString> *)&local_f8);
      if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
        }
      }
      pQVar10 = (QArrayData *)&pQVar10[1].alloc;
      lVar12 = lVar12 + -0x18;
    } while (lVar12 != 0);
  }
  lVar12 = (this->m_qmakepath).d.size;
  if (lVar12 != 0) {
    pQVar10 = (QArrayData *)(this->m_qmakepath).d.ptr;
    lVar12 = lVar12 * 0x18;
    do {
      local_128.m_string.d.d = (Data *)pQVar10;
      local_128.m_string.d.ptr = (char16_t *)local_98;
      QStringBuilder<const_QString_&,_QString_&>::convertTo<QString>
                ((QString *)local_78,(QStringBuilder<const_QString_&,_QString_&> *)&local_128);
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_f8,local_f8.size,(QString *)local_78);
      QList<QString>::end((QList<QString> *)&local_f8);
      if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
        }
      }
      pQVar10 = (QArrayData *)&pQVar10[1].alloc;
      lVar12 = lVar12 + -0x18;
    } while (lVar12 != 0);
  }
  if ((this->m_qmakespec).d.size != 0) {
    local_128.m_string.d.ptr = (char16_t *)local_b8;
    local_128.m_string.d.d = (Data *)&this->m_qmakespec;
    QStringBuilder<QString_&,_QString_&>::convertTo<QString>
              ((QString *)local_78,(QStringBuilder<QString_&,_QString_&> *)&local_128);
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_d8,local_d8.size,(QString *)local_78);
    QList<QString>::end((QList<QString> *)&local_d8);
    if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
      }
    }
    local_160.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QDir::QDir((QDir *)&local_160,(QString *)&this->m_qmakespec);
    do {
      cVar6 = QDir::isRoot();
      if ((cVar6 != '\0') || (cVar6 = QDir::cdUp(), cVar6 == '\0')) break;
      local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QDir::path();
      cVar6 = QString::endsWith((QString *)local_78,(CaseSensitivity)local_98);
      if (cVar6 != '\0') {
        local_190.super_ProString.m_string.d.ptr = (char16_t *)local_b8;
        local_190.super_ProString.m_string.d.d = (Data *)local_78;
        QStringBuilder<const_QString_&,_QString_&>::convertTo<QString>
                  (&local_128.m_string,(QStringBuilder<const_QString_&,_QString_&> *)&local_190);
        FVar7 = QMakeInternal::IoUtils::fileType(&local_128.m_string);
        if (&(local_128.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_128.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (FVar7 != FileNotFound) {
          QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                    ((QMovableArrayOps<QString> *)&local_f8,local_f8.size,(QString *)local_78);
          QList<QString>::end((QList<QString> *)&local_f8);
        }
      }
      if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
        }
      }
    } while (cVar6 == '\0');
    QDir::~QDir((QDir *)&local_160);
  }
  pQVar2 = this->m_option;
  ProKey::ProKey(&local_190,"QT_HOST_DATA/get");
  QMakeProperty::value(&local_128,pQVar2->property,&local_190);
  ProString::ProString((ProString *)local_78,&local_128);
  local_48 = (QString *)local_98;
  QStringBuilder<ProString,_QString_&>::convertTo<QString>
            (&local_160,(QStringBuilder<ProString,_QString_&> *)local_78);
  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
            ((QMovableArrayOps<QString> *)&local_f8,local_f8.size,&local_160);
  QList<QString>::end((QList<QString> *)&local_f8);
  if (&(local_160.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_160.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_160.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_160.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_160.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
    }
  }
  if (&(local_128.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_128.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_190.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_190.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_190.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_190.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_190.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar2 = this->m_option;
  ProKey::ProKey(&local_190,"QT_HOST_DATA/src");
  QMakeProperty::value(&local_128,pQVar2->property,&local_190);
  ProString::ProString((ProString *)local_78,&local_128);
  local_48 = (QString *)local_98;
  QStringBuilder<ProString,_QString_&>::convertTo<QString>
            (&local_160,(QStringBuilder<ProString,_QString_&> *)local_78);
  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
            ((QMovableArrayOps<QString> *)&local_f8,local_f8.size,&local_160);
  QList<QString>::end((QList<QString> *)&local_f8);
  if (&(local_160.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_160.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_160.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_160.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_160.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
    }
  }
  if (&(local_128.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_128.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_190.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_190.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_190.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_190.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_190.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (local_f8.size != 0) {
    puVar1 = (undefined1 *)((long)local_f8.ptr + local_f8.size * 0x18);
    pQVar10 = (QArrayData *)local_f8.ptr;
    do {
      local_128.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_128.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_128.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      ProKey::ProKey((ProKey *)local_78,"QMAKE_PLATFORM");
      values((ProStringList *)&local_128,this,(ProKey *)local_78);
      if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
        }
      }
      if ((ProString *)local_128.m_string.d.size != (ProString *)0x0) {
        lVar12 = local_128.m_string.d.size * 0x30;
        pPVar11 = (ProString *)local_128.m_string.d.ptr;
        do {
          local_78._8_8_ = local_b8;
          local_78[0x18] = '/';
          local_78._0_8_ = pQVar10;
          local_78._16_8_ = pPVar11;
          QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_QString_&>,_const_ProString_&>,_QLatin1Char>
          ::convertTo<QString>
                    ((QString *)&local_190,
                     (QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_QString_&>,_const_ProString_&>,_QLatin1Char>
                      *)local_78);
          QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                    ((QMovableArrayOps<QString> *)&local_d8,local_d8.size,(QString *)&local_190);
          QList<QString>::end((QList<QString> *)&local_d8);
          if (&(local_190.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_190.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 ((local_190.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_190.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate
                        (&(local_190.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          pPVar11 = pPVar11 + 1;
          lVar12 = lVar12 + -0x30;
        } while (lVar12 != 0);
      }
      local_190.super_ProString.m_string.d.ptr = (char16_t *)local_b8;
      local_190.super_ProString.m_string.d.d = (Data *)pQVar10;
      QStringBuilder<const_QString_&,_QString_&>::convertTo<QString>
                ((QString *)local_78,(QStringBuilder<const_QString_&,_QString_&> *)&local_190);
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_d8,local_d8.size,(QString *)local_78);
      QList<QString>::end((QList<QString> *)&local_d8);
      if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
        }
      }
      QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_128);
      pQVar10 = (QArrayData *)&pQVar10[1].alloc;
    } while (pQVar10 != (QArrayData *)puVar1);
  }
  if (local_d8.size != 0) {
    sVar9 = 0;
    uVar14 = 0;
    do {
      cVar6 = QString::endsWith((QChar)((short)local_d8.ptr + sVar9),0x2f);
      if (cVar6 == '\0') {
        pQVar8 = QList<QString>::data((QList<QString> *)&local_d8);
        QString::append((QChar)((short)pQVar8 + sVar9));
      }
      uVar14 = uVar14 + 1;
      sVar9 = sVar9 + 0x18;
    } while (uVar14 < (ulong)local_d8.size);
  }
  QtPrivate::QStringList_removeDuplicates((QList *)&local_d8);
  local_78._0_8_ = (QString *)0x0;
  local_78._8_8_ = (QString *)0x0;
  local_78._16_8_ = (ProString *)0x0;
  if (local_d8.size != 0) {
    lVar12 = local_d8.size * 0x18;
    pQVar13 = local_d8.ptr;
    do {
      FVar7 = QMakeInternal::IoUtils::fileType(pQVar13);
      if (FVar7 != FileNotFound) {
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)local_78,local_78._16_8_,pQVar13);
        QList<QString>::end((QList<QString> *)local_78);
      }
      pQVar13 = pQVar13 + 1;
      lVar12 = lVar12 + -0x18;
    } while (lVar12 != 0);
  }
  uVar5 = local_78._16_8_;
  uVar4 = local_78._8_8_;
  uVar3 = local_78._0_8_;
  ptr = (QMakeFeatureRoots *)operator_new(0x28);
  (ptr->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  (ptr->paths).d.d = (Data *)uVar3;
  (ptr->paths).d.ptr = (QString *)uVar4;
  (ptr->paths).d.size = uVar5;
  if ((QString *)uVar3 != (QString *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&((DataPointer *)uVar3)->d)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)&((DataPointer *)uVar3)->d)->_q_value).super___atomic_base<int>._M_i +
         1;
    UNLOCK();
  }
  (ptr->cache).d = (Data *)0x0;
  QExplicitlySharedDataPointer<QMakeFeatureRoots>::reset(&this->m_featureRoots,ptr);
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_78);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_148);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_f8);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_d8);
  if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMakeEvaluator::updateFeaturePaths()
{
    QString mkspecs_concat = QLatin1String("/mkspecs");
    QString features_concat = QLatin1String("/features/");

    QStringList feature_roots;

    feature_roots += m_option->getPathListEnv(QLatin1String("QMAKEFEATURES"));
    feature_roots += m_qmakefeatures;
    feature_roots += m_option->splitPathList(
                m_option->propertyValue(ProKey("QMAKEFEATURES")).toQString());

    QStringList feature_bases;
    if (!m_buildRoot.isEmpty()) {
        feature_bases << m_buildRoot + mkspecs_concat;
        feature_bases << m_buildRoot;
    }
    if (!m_sourceRoot.isEmpty()) {
        feature_bases << m_sourceRoot + mkspecs_concat;
        feature_bases << m_sourceRoot;
    }

    const auto items = m_option->getPathListEnv(QLatin1String("QMAKEPATH"));
    for (const QString &item : items)
        feature_bases << (item + mkspecs_concat);

    for (const QString &item : std::as_const(m_qmakepath))
        feature_bases << (item + mkspecs_concat);

    if (!m_qmakespec.isEmpty()) {
        // The spec is already platform-dependent, so no subdirs here.
        feature_roots << (m_qmakespec + features_concat);

        // Also check directly under the root directory of the mkspecs collection
        QDir specdir(m_qmakespec);
        while (!specdir.isRoot() && specdir.cdUp()) {
            const QString specpath = specdir.path();
            if (specpath.endsWith(mkspecs_concat)) {
                if (IoUtils::exists(specpath + features_concat))
                    feature_bases << specpath;
                break;
            }
        }
    }

    feature_bases << (m_option->propertyValue(ProKey("QT_HOST_DATA/get")) + mkspecs_concat);
    feature_bases << (m_option->propertyValue(ProKey("QT_HOST_DATA/src")) + mkspecs_concat);

    for (const QString &fb : std::as_const(feature_bases)) {
        const auto sfxs = values(ProKey("QMAKE_PLATFORM"));
        for (const ProString &sfx : sfxs)
            feature_roots << (fb + features_concat + sfx + QLatin1Char('/'));
        feature_roots << (fb + features_concat);
    }

    for (int i = 0; i < feature_roots.size(); ++i)
        if (!feature_roots.at(i).endsWith(QLatin1Char('/')))
            feature_roots[i].append(QLatin1Char('/'));

    feature_roots.removeDuplicates();

    QStringList ret;
    for (const QString &root : std::as_const(feature_roots))
        if (IoUtils::exists(root))
            ret << root;
    m_featureRoots = new QMakeFeatureRoots(ret);
}